

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveType.cpp
# Opt level: O1

void __thiscall hdc::PrimitiveType::PrimitiveType(PrimitiveType *this)

{
  ASTNode::ASTNode((ASTNode *)this);
  (this->super_Type).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_00196ac0;
  (this->token).lexem._M_dataplus._M_p = (pointer)&(this->token).lexem.field_2;
  (this->token).lexem._M_string_length = 0;
  (this->token).lexem.field_2._M_local_buf[0] = '\0';
  (this->super_Type).super_ASTNode.kind = AST_PRIMITIVE_TYPE;
  return;
}

Assistant:

PrimitiveType::PrimitiveType() {
    this->kind = AST_PRIMITIVE_TYPE;
}